

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# switch.cpp
# Opt level: O1

void __thiscall QtMWidgets::SwitchPrivate::SwitchPrivate(SwitchPrivate *this,Switch *parent)

{
  this->q = parent;
  this->state = AcceptedUncheck;
  (this->onText).d.d = (Data *)0x0;
  (this->onText).d.ptr = (char16_t *)0x0;
  (this->onText).d.size = 0;
  (this->offText).d.d = (Data *)0x0;
  (this->offText).d.ptr = (char16_t *)0x0;
  (this->offText).d.size = 0;
  (this->onColor).cspec = Invalid;
  (this->onColor).ct.argb.alpha = 0xffff;
  *(undefined8 *)((long)&(this->onColor).ct + 2) = 0;
  (this->mousePos).xp = 0;
  (this->mousePos).yp = 0;
  this->radius = 0;
  this->textWidth = 0;
  this->offset = 0;
  this->mouseMoveDelta = 0;
  this->leftMouseButtonPressed = false;
  init(this,(EVP_PKEY_CTX *)parent);
  return;
}

Assistant:

explicit SwitchPrivate( Switch * parent )
		:	q( parent )
		,	state( Switch::AcceptedUncheck )
		,	radius( 0 )
		,	textWidth( 0 )
		,	offset( 0 )
		,	mouseMoveDelta( 0 )
		,	leftMouseButtonPressed( false )
	{
		init();
	}